

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIntegerStateQueryTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::IntegerStateQueryTests::init
          (IntegerStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  undefined4 uVar1;
  undefined4 uVar2;
  TestContext *pTVar3;
  Context *pCVar4;
  GetBooleanVerifier *pGVar5;
  int iVar6;
  GetBooleanVerifier *pGVar7;
  undefined4 extraout_var;
  GetIntegerVerifier *pGVar8;
  undefined4 extraout_var_00;
  GetInteger64Verifier *pGVar9;
  undefined4 extraout_var_01;
  GetFloatVerifier *pGVar10;
  undefined4 extraout_var_02;
  TestContext *pTVar11;
  long *plVar12;
  ApiCase *pAVar13;
  ulong uVar14;
  TestNode *pTVar15;
  long *extraout_RAX;
  char *pcVar16;
  undefined8 uVar17;
  long *plVar18;
  int _verifierNdx_18;
  IntegerStateQueryTests *pIVar19;
  int _verifierNdx_37;
  int _verifierNdx;
  long lVar20;
  long lVar21;
  int _verifierNdx_40;
  int _verifierNdx_2;
  StateVerifier *implementationLimitVerifiers [3];
  long *local_140;
  long local_138;
  long local_130;
  long lStack_128;
  long *local_120;
  long local_118;
  long local_110;
  long lStack_108;
  IntegerStateQueryTests *local_100;
  long *local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  GetBooleanVerifier *local_d8;
  GetIntegerVerifier *pGStack_d0;
  undefined1 local_c8 [32];
  long *local_a8;
  long local_98 [2];
  GetBooleanVerifier *local_88;
  undefined8 uStack_80;
  char *local_78;
  char *local_70;
  TestContext *local_68;
  undefined8 uStack_60;
  ulong local_50;
  GetBooleanVerifier *local_48;
  GetInteger64Verifier *local_40;
  GetFloatVerifier *local_38;
  
  pGVar7 = (GetBooleanVerifier *)operator_new(0x28);
  iVar6 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&(pGVar7->super_StateVerifier).super_CallLogWrapper,
             (Functions *)CONCAT44(extraout_var,iVar6),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  (pGVar7->super_StateVerifier).m_testNamePostfix = "_getboolean";
  (pGVar7->super_StateVerifier).super_CallLogWrapper.m_enableLog = true;
  (pGVar7->super_StateVerifier)._vptr_StateVerifier = (_func_int **)&PTR__StateVerifier_0214bab8;
  this->m_verifierBoolean = pGVar7;
  pGVar8 = (GetIntegerVerifier *)operator_new(0x28);
  iVar6 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&(pGVar8->super_StateVerifier).super_CallLogWrapper,
             (Functions *)CONCAT44(extraout_var_00,iVar6),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  (pGVar8->super_StateVerifier).m_testNamePostfix = "_getinteger";
  (pGVar8->super_StateVerifier).super_CallLogWrapper.m_enableLog = true;
  (pGVar8->super_StateVerifier)._vptr_StateVerifier = (_func_int **)&PTR__StateVerifier_0214bb20;
  this->m_verifierInteger = pGVar8;
  pGVar9 = (GetInteger64Verifier *)operator_new(0x28);
  iVar6 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&(pGVar9->super_StateVerifier).super_CallLogWrapper,
             (Functions *)CONCAT44(extraout_var_01,iVar6),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  (pGVar9->super_StateVerifier).m_testNamePostfix = "_getinteger64";
  (pGVar9->super_StateVerifier).super_CallLogWrapper.m_enableLog = true;
  (pGVar9->super_StateVerifier)._vptr_StateVerifier = (_func_int **)&PTR__StateVerifier_0214bb88;
  this->m_verifierInteger64 = pGVar9;
  pGVar10 = (GetFloatVerifier *)operator_new(0x28);
  iVar6 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&(pGVar10->super_StateVerifier).super_CallLogWrapper,
             (Functions *)CONCAT44(extraout_var_02,iVar6),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  (pGVar10->super_StateVerifier).m_testNamePostfix = "_getfloat";
  (pGVar10->super_StateVerifier).super_CallLogWrapper.m_enableLog = true;
  (pGVar10->super_StateVerifier)._vptr_StateVerifier = (_func_int **)&PTR__StateVerifier_0214bbf0;
  this->m_verifierFloat = pGVar10;
  local_48 = this->m_verifierBoolean;
  local_40 = this->m_verifierInteger64;
  local_38 = pGVar10;
  pTVar11 = (TestContext *)0x0;
  local_100 = this;
  do {
    local_68 = pTVar11;
    lVar20 = 0;
    do {
      pTVar3 = (TestContext *)(&local_48)[lVar20];
      local_c8._16_8_ = operator_new(0xa8);
      pCVar4 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,(&PTR_anon_var_dwarf_1ea34b3_0214bc80)[(long)pTVar11 * 3],
                 (allocator<char> *)&local_120);
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_140);
      uVar17 = local_c8._16_8_;
      pGVar7 = (GetBooleanVerifier *)(plVar12 + 2);
      if ((GetBooleanVerifier *)*plVar12 == pGVar7) {
        local_c8._0_8_ = (pGVar7->super_StateVerifier)._vptr_StateVerifier;
        local_c8._8_8_ = plVar12[3];
        local_d8 = (GetBooleanVerifier *)local_c8;
      }
      else {
        local_c8._0_8_ = (pGVar7->super_StateVerifier)._vptr_StateVerifier;
        local_d8 = (GetBooleanVerifier *)*plVar12;
      }
      pGStack_d0 = (GetIntegerVerifier *)plVar12[1];
      *plVar12 = (long)pGVar7;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      pcVar16 = (&PTR_anon_var_dwarf_2afb6d5_0214bc88)[(long)pTVar11 * 3];
      local_88 = (GetBooleanVerifier *)(&DAT_0214bc90)[(long)pTVar11 * 3];
      uStack_80 = 0;
      ApiCase::ApiCase((ApiCase *)local_c8._16_8_,pCVar4,(char *)local_d8,pcVar16);
      this = local_100;
      (((TestCase *)uVar17)->super_TestCase).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_0214c460;
      (((ApiCase *)(uVar17 + 0x98))->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)local_88;
      (((ApiCase *)(uVar17 + 0x98))->super_TestCase).super_TestCase.super_TestNode.m_testCtx =
           pTVar3;
      tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)uVar17);
      if (local_d8 != (GetBooleanVerifier *)local_c8) {
        operator_delete(local_d8,local_c8._0_8_ + 1);
      }
      if (local_140 != &local_130) {
        operator_delete(local_140,local_130 + 1);
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 3);
    pTVar11 = (TestContext *)((long)&local_68->m_platform + 1);
  } while (pTVar11 != (TestContext *)0x28);
  uVar17 = CONCAT71((int7)((ulong)pcVar16 >> 8),1);
  lVar20 = 0;
  do {
    local_68 = (TestContext *)CONCAT44(local_68._4_4_,(int)uVar17);
    lVar21 = 0;
    do {
      pTVar11 = (TestContext *)(&local_48)[lVar21];
      local_c8._16_8_ = operator_new(0xa8);
      pCVar4 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,(&PTR_anon_var_dwarf_240268a_0214c040)[lVar20 * 3],
                 (allocator<char> *)&local_120);
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_140);
      uVar17 = local_c8._16_8_;
      pGVar7 = (GetBooleanVerifier *)(plVar12 + 2);
      if ((GetBooleanVerifier *)*plVar12 == pGVar7) {
        local_c8._0_8_ = (pGVar7->super_StateVerifier)._vptr_StateVerifier;
        local_c8._8_8_ = plVar12[3];
        local_d8 = (GetBooleanVerifier *)local_c8;
      }
      else {
        local_c8._0_8_ = (pGVar7->super_StateVerifier)._vptr_StateVerifier;
        local_d8 = (GetBooleanVerifier *)*plVar12;
      }
      pGStack_d0 = (GetIntegerVerifier *)plVar12[1];
      *plVar12 = (long)pGVar7;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      local_88 = (GetBooleanVerifier *)(&DAT_0214c050)[lVar20 * 3];
      uStack_80 = 0;
      ApiCase::ApiCase((ApiCase *)local_c8._16_8_,pCVar4,(char *)local_d8,
                       (&PTR_anon_var_dwarf_2afbbc5_0214c048)[lVar20 * 3]);
      this = local_100;
      (((TestCase *)uVar17)->super_TestCase).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_0214c4b8;
      (((ApiCase *)(uVar17 + 0x98))->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)local_88;
      (((ApiCase *)(uVar17 + 0x98))->super_TestCase).super_TestCase.super_TestNode.m_testCtx =
           pTVar11;
      tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)uVar17);
      if (local_d8 != (GetBooleanVerifier *)local_c8) {
        operator_delete(local_d8,local_c8._0_8_ + 1);
      }
      if (local_140 != &local_130) {
        operator_delete(local_140,local_130 + 1);
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 != 3);
    lVar20 = 1;
    uVar17 = 0;
  } while (((ulong)local_68 & 1) != 0);
  local_d8 = this->m_verifierBoolean;
  pGStack_d0 = this->m_verifierInteger;
  local_c8._0_8_ = this->m_verifierInteger64;
  local_c8._8_8_ = this->m_verifierFloat;
  lVar20 = 0;
  do {
    pGVar7 = (&local_48)[lVar20];
    pAVar13 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"sample_buffers","");
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_130 = *plVar18;
      lStack_128 = plVar12[3];
      local_140 = &local_130;
    }
    else {
      local_130 = *plVar18;
      local_140 = (long *)*plVar12;
    }
    local_138 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_140,"SAMPLE_BUFFERS");
    this = local_100;
    (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0214c510;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
    tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pAVar13);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 3);
  lVar20 = 0;
  do {
    pGVar7 = (&local_d8)[lVar20];
    pAVar13 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"samples","");
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_130 = *plVar18;
      lStack_128 = plVar12[3];
      local_140 = &local_130;
    }
    else {
      local_130 = *plVar18;
      local_140 = (long *)*plVar12;
    }
    local_138 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_140,"SAMPLES");
    this = local_100;
    (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0214c568;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
    tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pAVar13);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 4);
  lVar20 = 0;
  do {
    pTVar11 = (TestContext *)(&local_d8)[lVar20];
    pAVar13 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"generate_mipmap_hint","");
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
    local_140 = &local_130;
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_130 = *plVar18;
      lStack_128 = plVar12[3];
    }
    else {
      local_130 = *plVar18;
      local_140 = (long *)*plVar12;
    }
    local_138 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_140,"GENERATE_MIPMAP_HINT");
    this = local_100;
    (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0214c5c0;
    *(undefined4 *)&pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0x8192;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = pTVar11;
    tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pAVar13);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 4);
  lVar20 = 0;
  do {
    pTVar11 = (TestContext *)(&local_d8)[lVar20];
    pAVar13 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"fragment_shader_derivative_hint","");
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
    local_140 = &local_130;
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_130 = *plVar18;
      lStack_128 = plVar12[3];
    }
    else {
      local_130 = *plVar18;
      local_140 = (long *)*plVar12;
    }
    local_138 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_140,"FRAGMENT_SHADER_DERIVATIVE_HINT");
    this = local_100;
    (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0214c5c0;
    *(undefined4 *)&pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0x8b8b;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = pTVar11;
    tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pAVar13);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 4);
  lVar20 = 0;
  do {
    pGVar7 = (&local_d8)[lVar20];
    pAVar13 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"depth_func","");
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_130 = *plVar18;
      lStack_128 = plVar12[3];
      local_140 = &local_130;
    }
    else {
      local_130 = *plVar18;
      local_140 = (long *)*plVar12;
    }
    local_138 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_140,"DEPTH_FUNC");
    this = local_100;
    (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0214c618;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
    tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pAVar13);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 4);
  lVar20 = 0;
  do {
    pGVar7 = (&local_d8)[lVar20];
    pAVar13 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"cull_face_mode","");
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_130 = *plVar18;
      lStack_128 = plVar12[3];
      local_140 = &local_130;
    }
    else {
      local_130 = *plVar18;
      local_140 = (long *)*plVar12;
    }
    local_138 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_140,"CULL_FACE_MODE");
    this = local_100;
    (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0214c670;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
    tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pAVar13);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 4);
  lVar20 = 0;
  do {
    pGVar7 = (&local_d8)[lVar20];
    pAVar13 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"front_face_mode","");
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_130 = *plVar18;
      lStack_128 = plVar12[3];
      local_140 = &local_130;
    }
    else {
      local_130 = *plVar18;
      local_140 = (long *)*plVar12;
    }
    local_138 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_140,"FRONT_FACE");
    this = local_100;
    (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0214c6c8;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
    tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pAVar13);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 4);
  lVar20 = 0;
  do {
    pGVar7 = (&local_d8)[lVar20];
    pAVar13 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"viewport","");
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_130 = *plVar18;
      lStack_128 = plVar12[3];
      local_140 = &local_130;
    }
    else {
      local_130 = *plVar18;
      local_140 = (long *)*plVar12;
    }
    local_138 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_140,"VIEWPORT");
    this = local_100;
    (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0214c720;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
    tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pAVar13);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 4);
  lVar20 = 0;
  do {
    pGVar7 = (&local_d8)[lVar20];
    pAVar13 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"scissor_box","");
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_130 = *plVar18;
      lStack_128 = plVar12[3];
      local_140 = &local_130;
    }
    else {
      local_130 = *plVar18;
      local_140 = (long *)*plVar12;
    }
    local_138 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_140,"SCISSOR_BOX");
    this = local_100;
    (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0214c778;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
    tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pAVar13);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 4);
  lVar20 = 0;
  do {
    pGVar7 = (&local_d8)[lVar20];
    pAVar13 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"max_viewport_dims","");
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_130 = *plVar18;
      lStack_128 = plVar12[3];
      local_140 = &local_130;
    }
    else {
      local_130 = *plVar18;
      local_140 = (long *)*plVar12;
    }
    local_138 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_140,"MAX_VIEWPORT_DIMS");
    this = local_100;
    (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0214c7d0;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
    tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pAVar13);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 4);
  lVar20 = 0;
  do {
    pGVar7 = (&local_d8)[lVar20];
    pAVar13 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"stencil_ref","");
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
    local_140 = &local_130;
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_130 = *plVar18;
      lStack_128 = plVar12[3];
    }
    else {
      local_130 = *plVar18;
      local_140 = (long *)*plVar12;
    }
    local_138 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_140,"STENCIL_REF");
    this = local_100;
    (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0214c828;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
    *(undefined4 *)&pAVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 0xb97;
    tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pAVar13);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 4);
  lVar20 = 0;
  do {
    pGVar7 = (&local_d8)[lVar20];
    pAVar13 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"stencil_back_ref","");
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
    local_140 = &local_130;
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_130 = *plVar18;
      lStack_128 = plVar12[3];
    }
    else {
      local_130 = *plVar18;
      local_140 = (long *)*plVar12;
    }
    local_138 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_140,"STENCIL_BACK_REF");
    this = local_100;
    (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0214c828;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
    *(undefined4 *)&pAVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 0x8ca3;
    tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pAVar13);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 4);
  lVar20 = 0;
  do {
    pGVar7 = (&local_d8)[lVar20];
    pAVar13 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"stencil_ref_separate","");
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
    local_140 = &local_130;
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_130 = *plVar18;
      lStack_128 = plVar12[3];
    }
    else {
      local_130 = *plVar18;
      local_140 = (long *)*plVar12;
    }
    local_138 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_140,"STENCIL_REF (separate)");
    this = local_100;
    (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0214c880;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40400000b97
    ;
    tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pAVar13);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 4);
  lVar20 = 0;
  do {
    pGVar7 = (&local_d8)[lVar20];
    pAVar13 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"stencil_ref_separate_both","");
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
    local_140 = &local_130;
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_130 = *plVar18;
      lStack_128 = plVar12[3];
    }
    else {
      local_130 = *plVar18;
      local_140 = (long *)*plVar12;
    }
    local_138 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_140,"STENCIL_REF (separate)");
    this = local_100;
    (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0214c880;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40800000b97
    ;
    tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pAVar13);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 4);
  lVar20 = 0;
  do {
    pGVar7 = (&local_d8)[lVar20];
    pAVar13 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"stencil_back_ref_separate","");
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
    local_140 = &local_130;
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_130 = *plVar18;
      lStack_128 = plVar12[3];
    }
    else {
      local_130 = *plVar18;
      local_140 = (long *)*plVar12;
    }
    local_138 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_140,"STENCIL_BACK_REF (separate)");
    this = local_100;
    (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0214c880;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40500008ca3
    ;
    tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pAVar13);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 4);
  lVar20 = 0;
  do {
    pGVar7 = (&local_d8)[lVar20];
    pAVar13 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"stencil_back_ref_separate_both","");
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
    local_140 = &local_130;
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_130 = *plVar18;
      lStack_128 = plVar12[3];
    }
    else {
      local_130 = *plVar18;
      local_140 = (long *)*plVar12;
    }
    local_138 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_140,"STENCIL_BACK_REF (separate)");
    this = local_100;
    (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0214c880;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40800008ca3
    ;
    tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pAVar13);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 4);
  lVar20 = 0;
  do {
    local_50 = lVar20;
    lVar21 = 0;
    do {
      pGVar7 = (&local_d8)[lVar21];
      pAVar13 = (ApiCase *)operator_new(0xa8);
      pCVar4 = (local_100->super_TestCaseGroup).m_context;
      local_f8 = &local_e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"stencil_","");
      local_c8._16_8_ = (&DAT_0214c070)[lVar20 * 5];
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_f8);
      local_120 = &local_110;
      plVar18 = plVar12 + 2;
      if ((long *)*plVar12 == plVar18) {
        local_110 = *plVar18;
        lStack_108 = plVar12[3];
      }
      else {
        local_110 = *plVar18;
        local_120 = (long *)*plVar12;
      }
      local_118 = plVar12[1];
      *plVar12 = (long)plVar18;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
      local_140 = &local_130;
      plVar18 = plVar12 + 2;
      if ((long *)*plVar12 == plVar18) {
        local_130 = *plVar18;
        lStack_128 = plVar12[3];
      }
      else {
        local_130 = *plVar18;
        local_140 = (long *)*plVar12;
      }
      local_138 = plVar12[1];
      *plVar12 = (long)plVar18;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      local_88 = (GetBooleanVerifier *)(&DAT_0214c078)[lVar20 * 5];
      uVar1 = (&DAT_0214c080)[lVar20 * 10];
      ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_140,(char *)local_88);
      (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_0214c8d8;
      pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
      *(undefined4 *)&pAVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = uVar1;
      tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pAVar13);
      if (local_140 != &local_130) {
        operator_delete(local_140,local_130 + 1);
      }
      if (local_120 != &local_110) {
        operator_delete(local_120,local_110 + 1);
      }
      if (local_f8 != &local_e8) {
        operator_delete(local_f8,local_e8 + 1);
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 != 4);
    local_78 = (char *)CONCAT44(local_78._4_4_,uVar1);
    lVar21 = 0;
    do {
      pGVar7 = (&local_d8)[lVar21];
      pAVar13 = (ApiCase *)operator_new(0xa8);
      pCVar4 = (local_100->super_TestCaseGroup).m_context;
      local_f8 = &local_e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"stencil_back_","");
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_f8);
      local_120 = &local_110;
      plVar18 = plVar12 + 2;
      if ((long *)*plVar12 == plVar18) {
        local_110 = *plVar18;
        lStack_108 = plVar12[3];
      }
      else {
        local_110 = *plVar18;
        local_120 = (long *)*plVar12;
      }
      local_118 = plVar12[1];
      *plVar12 = (long)plVar18;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
      local_140 = &local_130;
      plVar18 = plVar12 + 2;
      if ((long *)*plVar12 == plVar18) {
        local_130 = *plVar18;
        lStack_128 = plVar12[3];
      }
      else {
        local_130 = *plVar18;
        local_140 = (long *)*plVar12;
      }
      local_138 = plVar12[1];
      *plVar12 = (long)plVar18;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      local_68 = (TestContext *)(&DAT_0214c088)[lVar20 * 5];
      uVar1 = (&DAT_0214c090)[lVar20 * 10];
      ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_140,(char *)local_68);
      (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_0214c8d8;
      pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
      *(undefined4 *)&pAVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = uVar1;
      tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pAVar13);
      if (local_140 != &local_130) {
        operator_delete(local_140,local_130 + 1);
      }
      if (local_120 != &local_110) {
        operator_delete(local_120,local_110 + 1);
      }
      if (local_f8 != &local_e8) {
        operator_delete(local_f8,local_e8 + 1);
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 != 4);
    lVar20 = 0;
    local_70 = (char *)CONCAT44(local_70._4_4_,uVar1);
    do {
      pGVar7 = (&local_d8)[lVar20];
      pAVar13 = (ApiCase *)operator_new(0xa8);
      pCVar4 = (local_100->super_TestCaseGroup).m_context;
      local_a8 = local_98;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"stencil_","");
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_a8);
      local_f8 = &local_e8;
      plVar18 = plVar12 + 2;
      if ((long *)*plVar12 == plVar18) {
        local_e8 = *plVar18;
        lStack_e0 = plVar12[3];
      }
      else {
        local_e8 = *plVar18;
        local_f8 = (long *)*plVar12;
      }
      local_f0 = plVar12[1];
      *plVar12 = (long)plVar18;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_f8);
      local_120 = &local_110;
      plVar18 = plVar12 + 2;
      if ((long *)*plVar12 == plVar18) {
        local_110 = *plVar18;
        lStack_108 = plVar12[3];
      }
      else {
        local_110 = *plVar18;
        local_120 = (long *)*plVar12;
      }
      local_118 = plVar12[1];
      *plVar12 = (long)plVar18;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
      local_140 = &local_130;
      plVar18 = plVar12 + 2;
      if ((long *)*plVar12 == plVar18) {
        local_130 = *plVar18;
        lStack_128 = plVar12[3];
      }
      else {
        local_130 = *plVar18;
        local_140 = (long *)*plVar12;
      }
      local_138 = plVar12[1];
      *plVar12 = (long)plVar18;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_140,(char *)local_88);
      pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
      *(undefined4 *)&pAVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx =
           local_78._0_4_;
      (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_0214c938;
      *(undefined4 *)((long)&pAVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4)
           = 0x408;
      tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pAVar13);
      if (local_140 != &local_130) {
        operator_delete(local_140,local_130 + 1);
      }
      if (local_120 != &local_110) {
        operator_delete(local_120,local_110 + 1);
      }
      if (local_f8 != &local_e8) {
        operator_delete(local_f8,local_e8 + 1);
      }
      if (local_a8 != local_98) {
        operator_delete(local_a8,local_98[0] + 1);
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 4);
    lVar20 = 0;
    do {
      pGVar7 = (&local_d8)[lVar20];
      pAVar13 = (ApiCase *)operator_new(0xa8);
      pCVar4 = (local_100->super_TestCaseGroup).m_context;
      local_a8 = local_98;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"stencil_back_","");
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_a8);
      local_f8 = &local_e8;
      plVar18 = plVar12 + 2;
      if ((long *)*plVar12 == plVar18) {
        local_e8 = *plVar18;
        lStack_e0 = plVar12[3];
      }
      else {
        local_e8 = *plVar18;
        local_f8 = (long *)*plVar12;
      }
      local_f0 = plVar12[1];
      *plVar12 = (long)plVar18;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_f8);
      local_120 = &local_110;
      plVar18 = plVar12 + 2;
      if ((long *)*plVar12 == plVar18) {
        local_110 = *plVar18;
        lStack_108 = plVar12[3];
      }
      else {
        local_110 = *plVar18;
        local_120 = (long *)*plVar12;
      }
      local_118 = plVar12[1];
      *plVar12 = (long)plVar18;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
      local_140 = &local_130;
      plVar18 = plVar12 + 2;
      if ((long *)*plVar12 == plVar18) {
        local_130 = *plVar18;
        lStack_128 = plVar12[3];
      }
      else {
        local_130 = *plVar18;
        local_140 = (long *)*plVar12;
      }
      local_138 = plVar12[1];
      *plVar12 = (long)plVar18;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_140,(char *)local_68);
      pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
      *(undefined4 *)&pAVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx =
           local_70._0_4_;
      (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_0214c938;
      *(undefined4 *)((long)&pAVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4)
           = 0x408;
      tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pAVar13);
      if (local_140 != &local_130) {
        operator_delete(local_140,local_130 + 1);
      }
      if (local_120 != &local_110) {
        operator_delete(local_120,local_110 + 1);
      }
      if (local_f8 != &local_e8) {
        operator_delete(local_f8,local_e8 + 1);
      }
      if (local_a8 != local_98) {
        operator_delete(local_a8,local_98[0] + 1);
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 4);
    lVar20 = 0;
    do {
      pGVar7 = (&local_d8)[lVar20];
      pAVar13 = (ApiCase *)operator_new(0xa8);
      pCVar4 = (local_100->super_TestCaseGroup).m_context;
      local_a8 = local_98;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"stencil_","");
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_a8);
      local_f8 = &local_e8;
      plVar18 = plVar12 + 2;
      if ((long *)*plVar12 == plVar18) {
        local_e8 = *plVar18;
        lStack_e0 = plVar12[3];
      }
      else {
        local_e8 = *plVar18;
        local_f8 = (long *)*plVar12;
      }
      local_f0 = plVar12[1];
      *plVar12 = (long)plVar18;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_f8);
      local_120 = &local_110;
      plVar18 = plVar12 + 2;
      if ((long *)*plVar12 == plVar18) {
        local_110 = *plVar18;
        lStack_108 = plVar12[3];
      }
      else {
        local_110 = *plVar18;
        local_120 = (long *)*plVar12;
      }
      local_118 = plVar12[1];
      *plVar12 = (long)plVar18;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
      local_140 = &local_130;
      plVar18 = plVar12 + 2;
      if ((long *)*plVar12 == plVar18) {
        local_130 = *plVar18;
        lStack_128 = plVar12[3];
      }
      else {
        local_130 = *plVar18;
        local_140 = (long *)*plVar12;
      }
      local_138 = plVar12[1];
      *plVar12 = (long)plVar18;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_140,(char *)local_88);
      pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
      *(undefined4 *)&pAVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx =
           local_78._0_4_;
      (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_0214c938;
      *(undefined4 *)((long)&pAVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4)
           = 0x404;
      tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pAVar13);
      if (local_140 != &local_130) {
        operator_delete(local_140,local_130 + 1);
      }
      if (local_120 != &local_110) {
        operator_delete(local_120,local_110 + 1);
      }
      if (local_f8 != &local_e8) {
        operator_delete(local_f8,local_e8 + 1);
      }
      if (local_a8 != local_98) {
        operator_delete(local_a8,local_98[0] + 1);
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 4);
    lVar20 = 0;
    do {
      pGVar7 = (&local_d8)[lVar20];
      pAVar13 = (ApiCase *)operator_new(0xa8);
      pCVar4 = (local_100->super_TestCaseGroup).m_context;
      local_a8 = local_98;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"stencil_back_","");
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_a8);
      local_f8 = &local_e8;
      plVar18 = plVar12 + 2;
      if ((long *)*plVar12 == plVar18) {
        local_e8 = *plVar18;
        lStack_e0 = plVar12[3];
      }
      else {
        local_e8 = *plVar18;
        local_f8 = (long *)*plVar12;
      }
      local_f0 = plVar12[1];
      *plVar12 = (long)plVar18;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_f8);
      local_120 = &local_110;
      plVar18 = plVar12 + 2;
      if ((long *)*plVar12 == plVar18) {
        local_110 = *plVar18;
        lStack_108 = plVar12[3];
      }
      else {
        local_110 = *plVar18;
        local_120 = (long *)*plVar12;
      }
      local_118 = plVar12[1];
      *plVar12 = (long)plVar18;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
      local_140 = &local_130;
      plVar18 = plVar12 + 2;
      if ((long *)*plVar12 == plVar18) {
        local_130 = *plVar18;
        lStack_128 = plVar12[3];
      }
      else {
        local_130 = *plVar18;
        local_140 = (long *)*plVar12;
      }
      local_138 = plVar12[1];
      *plVar12 = (long)plVar18;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_140,(char *)local_68);
      pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
      *(undefined4 *)&pAVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx =
           local_70._0_4_;
      (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_0214c938;
      *(undefined4 *)((long)&pAVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4)
           = 0x405;
      tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pAVar13);
      if (local_140 != &local_130) {
        operator_delete(local_140,local_130 + 1);
      }
      if (local_120 != &local_110) {
        operator_delete(local_120,local_110 + 1);
      }
      if (local_f8 != &local_e8) {
        operator_delete(local_f8,local_e8 + 1);
      }
      if (local_a8 != local_98) {
        operator_delete(local_a8,local_98[0] + 1);
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 4);
    lVar20 = local_50 + 1;
  } while (lVar20 != 3);
  lVar20 = 0;
  pIVar19 = local_100;
  do {
    pGVar7 = (&local_d8)[lVar20];
    pAVar13 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (pIVar19->super_TestCaseGroup).m_context;
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"stencil_func","");
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
    local_140 = &local_130;
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_130 = *plVar18;
      lStack_128 = plVar12[3];
    }
    else {
      local_130 = *plVar18;
      local_140 = (long *)*plVar12;
    }
    local_138 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_140,"STENCIL_FUNC");
    pIVar19 = local_100;
    (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0214c998;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
    tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pAVar13);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 4);
  lVar20 = 0;
  do {
    pGVar7 = (&local_d8)[lVar20];
    pAVar13 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (pIVar19->super_TestCaseGroup).m_context;
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"stencil_func_separate","")
    ;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
    local_140 = &local_130;
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_130 = *plVar18;
      lStack_128 = plVar12[3];
    }
    else {
      local_130 = *plVar18;
      local_140 = (long *)*plVar12;
    }
    local_138 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_140,"STENCIL_FUNC (separate)");
    pIVar19 = local_100;
    (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0214c9f0;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40400000b92
    ;
    tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pAVar13);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 4);
  lVar20 = 0;
  do {
    pGVar7 = (&local_d8)[lVar20];
    pAVar13 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (pIVar19->super_TestCaseGroup).m_context;
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"stencil_func_separate_both","");
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
    local_140 = &local_130;
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_130 = *plVar18;
      lStack_128 = plVar12[3];
    }
    else {
      local_130 = *plVar18;
      local_140 = (long *)*plVar12;
    }
    local_138 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_140,"STENCIL_FUNC (separate)");
    pIVar19 = local_100;
    (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0214c9f0;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40800000b92
    ;
    tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pAVar13);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 4);
  lVar20 = 0;
  do {
    pGVar7 = (&local_d8)[lVar20];
    pAVar13 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (pIVar19->super_TestCaseGroup).m_context;
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"stencil_back_func_separate","");
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
    local_140 = &local_130;
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_130 = *plVar18;
      lStack_128 = plVar12[3];
    }
    else {
      local_130 = *plVar18;
      local_140 = (long *)*plVar12;
    }
    local_138 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_140,"STENCIL_FUNC (separate)");
    pIVar19 = local_100;
    (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0214c9f0;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40500008800
    ;
    tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pAVar13);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 4);
  lVar20 = 0;
  do {
    pGVar7 = (&local_d8)[lVar20];
    pAVar13 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (pIVar19->super_TestCaseGroup).m_context;
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"stencil_back_func_separate_both","");
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
    local_140 = &local_130;
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_130 = *plVar18;
      lStack_128 = plVar12[3];
    }
    else {
      local_130 = *plVar18;
      local_140 = (long *)*plVar12;
    }
    local_138 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_140,"STENCIL_FUNC (separate)");
    pIVar19 = local_100;
    (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0214c9f0;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40800008800
    ;
    tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pAVar13);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 4);
  lVar20 = 0;
  do {
    pGVar7 = (&local_d8)[lVar20];
    pAVar13 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (pIVar19->super_TestCaseGroup).m_context;
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"stencil_value_mask","");
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
    local_140 = &local_130;
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_130 = *plVar18;
      lStack_128 = plVar12[3];
    }
    else {
      local_130 = *plVar18;
      local_140 = (long *)*plVar12;
    }
    local_138 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_140,"STENCIL_VALUE_MASK");
    pIVar19 = local_100;
    (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0214ca48;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
    *(undefined4 *)&pAVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 0xb93;
    tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pAVar13);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 4);
  lVar20 = 0;
  do {
    pGVar7 = (&local_d8)[lVar20];
    pAVar13 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (pIVar19->super_TestCaseGroup).m_context;
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"stencil_back_value_mask","");
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
    local_140 = &local_130;
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_130 = *plVar18;
      lStack_128 = plVar12[3];
    }
    else {
      local_130 = *plVar18;
      local_140 = (long *)*plVar12;
    }
    local_138 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_140,"STENCIL_BACK_VALUE_MASK");
    pIVar19 = local_100;
    (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0214ca48;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
    *(undefined4 *)&pAVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 0x8ca4;
    tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pAVar13);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 4);
  lVar20 = 0;
  do {
    pGVar7 = (&local_d8)[lVar20];
    pAVar13 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (pIVar19->super_TestCaseGroup).m_context;
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"stencil_value_mask_separate","");
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
    local_140 = &local_130;
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_130 = *plVar18;
      lStack_128 = plVar12[3];
    }
    else {
      local_130 = *plVar18;
      local_140 = (long *)*plVar12;
    }
    local_138 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_140,"STENCIL_VALUE_MASK (separate)");
    pIVar19 = local_100;
    (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0214caa0;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40400000b93
    ;
    tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pAVar13);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 4);
  lVar20 = 0;
  do {
    pGVar7 = (&local_d8)[lVar20];
    pAVar13 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (pIVar19->super_TestCaseGroup).m_context;
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"stencil_value_mask_separate_both","");
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
    local_140 = &local_130;
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_130 = *plVar18;
      lStack_128 = plVar12[3];
    }
    else {
      local_130 = *plVar18;
      local_140 = (long *)*plVar12;
    }
    local_138 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_140,"STENCIL_VALUE_MASK (separate)");
    pIVar19 = local_100;
    (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0214caa0;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40800000b93
    ;
    tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pAVar13);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 4);
  lVar20 = 0;
  do {
    pGVar7 = (&local_d8)[lVar20];
    pAVar13 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (pIVar19->super_TestCaseGroup).m_context;
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"stencil_back_value_mask_separate","");
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
    local_140 = &local_130;
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_130 = *plVar18;
      lStack_128 = plVar12[3];
    }
    else {
      local_130 = *plVar18;
      local_140 = (long *)*plVar12;
    }
    local_138 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_140,"STENCIL_BACK_VALUE_MASK (separate)");
    pIVar19 = local_100;
    (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0214caa0;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40500008ca4
    ;
    tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pAVar13);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 4);
  lVar20 = 0;
  do {
    pGVar7 = (&local_d8)[lVar20];
    pAVar13 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (pIVar19->super_TestCaseGroup).m_context;
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"stencil_back_value_mask_separate_both","");
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
    local_140 = &local_130;
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_130 = *plVar18;
      lStack_128 = plVar12[3];
    }
    else {
      local_130 = *plVar18;
      local_140 = (long *)*plVar12;
    }
    local_138 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_140,"STENCIL_BACK_VALUE_MASK (separate)");
    pIVar19 = local_100;
    (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0214caa0;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40800008ca4
    ;
    tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pAVar13);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 4);
  lVar20 = 0;
  do {
    pGVar7 = (&local_d8)[lVar20];
    pAVar13 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (pIVar19->super_TestCaseGroup).m_context;
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"stencil_writemask","");
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
    local_140 = &local_130;
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_130 = *plVar18;
      lStack_128 = plVar12[3];
    }
    else {
      local_130 = *plVar18;
      local_140 = (long *)*plVar12;
    }
    local_138 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_140,"STENCIL_WRITEMASK");
    pIVar19 = local_100;
    (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0214caf8;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
    *(undefined4 *)&pAVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 0xb98;
    tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pAVar13);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 4);
  lVar20 = 0;
  do {
    pGVar7 = (&local_d8)[lVar20];
    pAVar13 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (pIVar19->super_TestCaseGroup).m_context;
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"stencil_back_writemask","");
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
    local_140 = &local_130;
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_130 = *plVar18;
      lStack_128 = plVar12[3];
    }
    else {
      local_130 = *plVar18;
      local_140 = (long *)*plVar12;
    }
    local_138 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_140,"STENCIL_BACK_WRITEMASK");
    pIVar19 = local_100;
    (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0214caf8;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
    *(undefined4 *)&pAVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 0x8ca5;
    tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pAVar13);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 4);
  lVar20 = 0;
  do {
    pGVar7 = (&local_d8)[lVar20];
    pAVar13 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (pIVar19->super_TestCaseGroup).m_context;
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"stencil_writemask_separate","");
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
    local_140 = &local_130;
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_130 = *plVar18;
      lStack_128 = plVar12[3];
    }
    else {
      local_130 = *plVar18;
      local_140 = (long *)*plVar12;
    }
    local_138 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_140,"STENCIL_WRITEMASK (separate)");
    pIVar19 = local_100;
    (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0214cb50;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40400000b98
    ;
    tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pAVar13);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 4);
  lVar20 = 0;
  do {
    pGVar7 = (&local_d8)[lVar20];
    pAVar13 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (pIVar19->super_TestCaseGroup).m_context;
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"stencil_writemask_separate_both","");
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
    local_140 = &local_130;
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_130 = *plVar18;
      lStack_128 = plVar12[3];
    }
    else {
      local_130 = *plVar18;
      local_140 = (long *)*plVar12;
    }
    local_138 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_140,"STENCIL_WRITEMASK (separate)");
    pIVar19 = local_100;
    (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0214cb50;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40800000b98
    ;
    tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pAVar13);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 4);
  lVar20 = 0;
  do {
    pGVar7 = (&local_d8)[lVar20];
    pAVar13 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (pIVar19->super_TestCaseGroup).m_context;
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"stencil_back_writemask_separate","");
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
    local_140 = &local_130;
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_130 = *plVar18;
      lStack_128 = plVar12[3];
    }
    else {
      local_130 = *plVar18;
      local_140 = (long *)*plVar12;
    }
    local_138 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_140,"STENCIL_BACK_WRITEMASK (separate)");
    pIVar19 = local_100;
    (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0214cb50;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40500008ca5
    ;
    tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pAVar13);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 4);
  lVar20 = 0;
  do {
    pGVar7 = (&local_d8)[lVar20];
    pAVar13 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (pIVar19->super_TestCaseGroup).m_context;
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"stencil_back_writemask_separate_both","");
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
    local_140 = &local_130;
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_130 = *plVar18;
      lStack_128 = plVar12[3];
    }
    else {
      local_130 = *plVar18;
      local_140 = (long *)*plVar12;
    }
    local_138 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_140,"STENCIL_BACK_WRITEMASK (separate)");
    pIVar19 = local_100;
    (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0214cb50;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x40800008ca5
    ;
    tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pAVar13);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 4);
  pGVar7 = (GetBooleanVerifier *)0x0;
  do {
    local_88 = pGVar7;
    lVar20 = 0;
    do {
      pGVar5 = (&local_d8)[lVar20];
      pAVar13 = (ApiCase *)operator_new(0xa8);
      pCVar4 = (pIVar19->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_120,(&PTR_anon_var_dwarf_2afbf4e_0214c0f0)[(long)pGVar7 * 3],
                 (allocator<char> *)&local_f8);
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
      local_140 = &local_130;
      plVar18 = plVar12 + 2;
      if ((long *)*plVar12 == plVar18) {
        local_130 = *plVar18;
        lStack_128 = plVar12[3];
      }
      else {
        local_130 = *plVar18;
        local_140 = (long *)*plVar12;
      }
      local_138 = plVar12[1];
      *plVar12 = (long)plVar18;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      local_c8._16_8_ = (&DAT_0214c100)[(long)pGVar7 * 3];
      local_c8._24_8_ = 0;
      ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_140,(char *)(&DAT_0214c0f8)[(long)pGVar7 * 3]);
      pIVar19 = local_100;
      (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_0214cba8;
      pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar5;
      pAVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx =
           (TestContext *)local_c8._16_8_;
      tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pAVar13);
      if (local_140 != &local_130) {
        operator_delete(local_140,local_130 + 1);
      }
      if (local_120 != &local_110) {
        operator_delete(local_120,local_110 + 1);
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 4);
    pGVar7 = (GetBooleanVerifier *)((long)&(local_88->super_StateVerifier)._vptr_StateVerifier + 1);
  } while (pGVar7 != (GetBooleanVerifier *)0x8);
  lVar20 = 0;
  do {
    pGVar7 = (&local_d8)[lVar20];
    pAVar13 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (pIVar19->super_TestCaseGroup).m_context;
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"unpack_alignment","");
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
    local_140 = &local_130;
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_130 = *plVar18;
      lStack_128 = plVar12[3];
    }
    else {
      local_130 = *plVar18;
      local_140 = (long *)*plVar12;
    }
    local_138 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_140,"UNPACK_ALIGNMENT");
    pIVar19 = local_100;
    (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0214cc00;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
    *(undefined4 *)&pAVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 0xcf5;
    tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pAVar13);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 4);
  lVar20 = 0;
  do {
    pGVar7 = (&local_d8)[lVar20];
    pAVar13 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (pIVar19->super_TestCaseGroup).m_context;
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"pack_alignment","");
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
    local_140 = &local_130;
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_130 = *plVar18;
      lStack_128 = plVar12[3];
    }
    else {
      local_130 = *plVar18;
      local_140 = (long *)*plVar12;
    }
    local_138 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_140,"PACK_ALIGNMENT");
    pIVar19 = local_100;
    (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0214cc00;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
    *(undefined4 *)&pAVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = 0xd05;
    tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pAVar13);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 4);
  uVar14 = 0;
  do {
    local_50 = uVar14;
    pTVar11 = (TestContext *)0x0;
    do {
      pGVar7 = (&local_d8)[(long)pTVar11];
      local_c8._16_8_ = operator_new(0xa8);
      pCVar4 = (pIVar19->super_TestCaseGroup).m_context;
      local_78 = (&PTR_anon_var_dwarf_1efd641_0214c1b0)[uVar14 * 3];
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_120,local_78,(allocator<char> *)&local_f8);
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
      uVar17 = local_c8._16_8_;
      local_140 = &local_130;
      plVar18 = plVar12 + 2;
      if ((long *)*plVar12 == plVar18) {
        local_130 = *plVar18;
        lStack_128 = plVar12[3];
      }
      else {
        local_130 = *plVar18;
        local_140 = (long *)*plVar12;
      }
      local_138 = plVar12[1];
      *plVar12 = (long)plVar18;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      local_70 = (char *)(&DAT_0214c1b8)[uVar14 * 3];
      uVar1 = (&DAT_0214c1c0)[uVar14 * 6];
      uVar2 = (&DAT_0214c1c4)[uVar14 * 6];
      local_88 = pGVar7;
      local_68 = pTVar11;
      ApiCase::ApiCase((ApiCase *)local_c8._16_8_,pCVar4,(char *)local_140,local_70);
      pIVar19 = local_100;
      (((TestCase *)uVar17)->super_TestCase).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_0214cc58;
      (((ApiCase *)(uVar17 + 0x98))->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)local_88;
      *(undefined4 *)
       &(((ApiCase *)(uVar17 + 0x98))->super_TestCase).super_TestCase.super_TestNode.m_testCtx =
           uVar1;
      *(undefined4 *)
       ((long)&(((ApiCase *)(uVar17 + 0x98))->super_TestCase).super_TestCase.super_TestNode.
               m_testCtx + 4) = uVar2;
      tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)uVar17);
      local_88 = (GetBooleanVerifier *)CONCAT44(local_88._4_4_,uVar2);
      local_c8._16_4_ = uVar1;
      if (local_140 != &local_130) {
        operator_delete(local_140,local_130 + 1);
      }
      if (local_120 != &local_110) {
        operator_delete(local_120,local_110 + 1);
      }
      pTVar11 = (TestContext *)((long)&local_68->m_platform + 1);
    } while (pTVar11 != (TestContext *)&DAT_00000004);
    lVar20 = 0;
    do {
      pGVar7 = (&local_d8)[lVar20];
      pAVar13 = (ApiCase *)operator_new(0xa8);
      pCVar4 = (pIVar19->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,local_78,(allocator<char> *)&local_a8);
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_f8);
      local_120 = &local_110;
      plVar18 = plVar12 + 2;
      if ((long *)*plVar12 == plVar18) {
        local_110 = *plVar18;
        lStack_108 = plVar12[3];
      }
      else {
        local_110 = *plVar18;
        local_120 = (long *)*plVar12;
      }
      local_118 = plVar12[1];
      *plVar12 = (long)plVar18;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
      local_140 = &local_130;
      plVar18 = plVar12 + 2;
      if ((long *)*plVar12 == plVar18) {
        local_130 = *plVar18;
        lStack_128 = plVar12[3];
      }
      else {
        local_130 = *plVar18;
        local_140 = (long *)*plVar12;
      }
      local_138 = plVar12[1];
      *plVar12 = (long)plVar18;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      pcVar16 = local_70;
      ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_140,local_70);
      pIVar19 = local_100;
      pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
      *(undefined4 *)&pAVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx =
           local_c8._16_4_;
      *(undefined4 *)((long)&pAVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4)
           = local_88._0_4_;
      (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_0214ccb8;
      tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pAVar13);
      if (local_140 != &local_130) {
        operator_delete(local_140,local_130 + 1);
      }
      if (local_120 != &local_110) {
        operator_delete(local_120,local_110 + 1);
      }
      if (local_f8 != &local_e8) {
        operator_delete(local_f8,local_e8 + 1);
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 4);
    uVar14 = local_50 + 1;
  } while (uVar14 != 4);
  uVar17 = CONCAT71((int7)((ulong)pcVar16 >> 8),1);
  lVar20 = 0;
  do {
    local_50 = CONCAT44(local_50._4_4_,(int)uVar17);
    pTVar11 = (TestContext *)0x0;
    do {
      pGVar7 = (&local_d8)[(long)pTVar11];
      local_c8._16_8_ = operator_new(0xa8);
      pCVar4 = (pIVar19->super_TestCaseGroup).m_context;
      local_78 = (&PTR_anon_var_dwarf_1efd69a_0214c210)[lVar20 * 3];
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_120,local_78,(allocator<char> *)&local_f8);
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
      uVar17 = local_c8._16_8_;
      local_140 = &local_130;
      plVar18 = plVar12 + 2;
      if ((long *)*plVar12 == plVar18) {
        local_130 = *plVar18;
        lStack_128 = plVar12[3];
      }
      else {
        local_130 = *plVar18;
        local_140 = (long *)*plVar12;
      }
      local_138 = plVar12[1];
      *plVar12 = (long)plVar18;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      local_70 = (char *)(&DAT_0214c218)[lVar20 * 3];
      uVar1 = (&DAT_0214c220)[lVar20 * 6];
      uVar2 = (&DAT_0214c224)[lVar20 * 6];
      local_88 = pGVar7;
      local_68 = pTVar11;
      ApiCase::ApiCase((ApiCase *)local_c8._16_8_,pCVar4,(char *)local_140,local_70);
      pIVar19 = local_100;
      (((TestCase *)uVar17)->super_TestCase).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_0214cd18;
      (((ApiCase *)(uVar17 + 0x98))->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)local_88;
      *(undefined4 *)
       &(((ApiCase *)(uVar17 + 0x98))->super_TestCase).super_TestCase.super_TestNode.m_testCtx =
           uVar1;
      *(undefined4 *)
       ((long)&(((ApiCase *)(uVar17 + 0x98))->super_TestCase).super_TestCase.super_TestNode.
               m_testCtx + 4) = uVar2;
      tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)uVar17);
      local_88 = (GetBooleanVerifier *)CONCAT44(local_88._4_4_,uVar2);
      local_c8._16_4_ = uVar1;
      if (local_140 != &local_130) {
        operator_delete(local_140,local_130 + 1);
      }
      if (local_120 != &local_110) {
        operator_delete(local_120,local_110 + 1);
      }
      pTVar11 = (TestContext *)((long)&local_68->m_platform + 1);
    } while (pTVar11 != (TestContext *)&DAT_00000004);
    lVar20 = 0;
    do {
      pGVar7 = (&local_d8)[lVar20];
      pAVar13 = (ApiCase *)operator_new(0xa8);
      pCVar4 = (pIVar19->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,local_78,(allocator<char> *)&local_a8);
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_f8);
      local_120 = &local_110;
      plVar18 = plVar12 + 2;
      if ((long *)*plVar12 == plVar18) {
        local_110 = *plVar18;
        lStack_108 = plVar12[3];
      }
      else {
        local_110 = *plVar18;
        local_120 = (long *)*plVar12;
      }
      local_118 = plVar12[1];
      *plVar12 = (long)plVar18;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
      local_140 = &local_130;
      plVar18 = plVar12 + 2;
      if ((long *)*plVar12 == plVar18) {
        local_130 = *plVar18;
        lStack_128 = plVar12[3];
      }
      else {
        local_130 = *plVar18;
        local_140 = (long *)*plVar12;
      }
      local_138 = plVar12[1];
      *plVar12 = (long)plVar18;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_140,local_70);
      pIVar19 = local_100;
      pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
      *(undefined4 *)&pAVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx =
           local_c8._16_4_;
      *(undefined4 *)((long)&pAVar13[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4)
           = local_88._0_4_;
      (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_0214cd78;
      tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pAVar13);
      if (local_140 != &local_130) {
        operator_delete(local_140,local_130 + 1);
      }
      if (local_120 != &local_110) {
        operator_delete(local_120,local_110 + 1);
      }
      if (local_f8 != &local_e8) {
        operator_delete(local_f8,local_e8 + 1);
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 != 4);
    lVar20 = 1;
    uVar17 = 0;
  } while ((local_50 & 1) != 0);
  lVar20 = 0;
  do {
    local_78 = (char *)lVar20;
    lVar21 = 0;
    do {
      pGVar7 = (&local_d8)[lVar21];
      local_c8._16_8_ = operator_new(0xb0);
      pCVar4 = (pIVar19->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_120,(char *)(&DAT_0214c240)[lVar20 * 4],
                 (allocator<char> *)&local_f8);
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
      uVar17 = local_c8._16_8_;
      local_140 = &local_130;
      plVar18 = plVar12 + 2;
      if ((long *)*plVar12 == plVar18) {
        local_130 = *plVar18;
        lStack_128 = plVar12[3];
      }
      else {
        local_130 = *plVar18;
        local_140 = (long *)*plVar12;
      }
      local_138 = plVar12[1];
      *plVar12 = (long)plVar18;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      local_68 = (TestContext *)(&DAT_0214c250)[lVar20 * 4];
      uStack_60 = 0;
      uVar1 = (&DAT_0214c258)[lVar20 * 8];
      local_88 = pGVar7;
      ApiCase::ApiCase((ApiCase *)local_c8._16_8_,pCVar4,(char *)local_140,
                       (char *)(&DAT_0214c248)[lVar20 * 4]);
      pIVar19 = local_100;
      (((TestCase *)uVar17)->super_TestCase).super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_0214cdd8;
      (((ApiCase *)(uVar17 + 0x98))->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)local_88;
      (((ApiCase *)(uVar17 + 0x98))->super_TestCase).super_TestCase.super_TestNode.m_testCtx =
           local_68;
      *(undefined4 *)
       &(((ApiCase *)(uVar17 + 0x98))->super_TestCase).super_TestCase.super_TestNode.m_name.
        _M_dataplus._M_p = uVar1;
      tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)uVar17);
      if (local_140 != &local_130) {
        operator_delete(local_140,local_130 + 1);
      }
      if (local_120 != &local_110) {
        operator_delete(local_120,local_110 + 1);
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 != 4);
    lVar20 = (long)local_78 + 1;
  } while (lVar20 != 3);
  lVar20 = 0;
  do {
    lVar21 = 0;
    local_88 = (GetBooleanVerifier *)lVar20;
    do {
      uVar1 = *(undefined4 *)((long)init::queryTypes + lVar21);
      pTVar15 = (TestNode *)operator_new(0x88);
      pCVar4 = (local_100->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_120,(char *)(&DAT_0214c2a0)[lVar20 * 3],
                 (allocator<char> *)&local_f8);
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
      local_140 = &local_130;
      plVar18 = plVar12 + 2;
      if ((long *)*plVar12 == plVar18) {
        local_130 = *plVar18;
        lStack_128 = plVar12[3];
      }
      else {
        local_130 = *plVar18;
        local_140 = (long *)*plVar12;
      }
      local_138 = plVar12[1];
      *plVar12 = (long)plVar18;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      local_c8._16_8_ = (&DAT_0214c2b0)[lVar20 * 3];
      local_c8._24_8_ = 0;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar15,pCVar4->m_testCtx,(char *)local_140,
                 (char *)(&DAT_0214c2a8)[lVar20 * 3]);
      pTVar15[1]._vptr_TestNode = (_func_int **)pCVar4;
      *(undefined4 *)&pTVar15[1].m_testCtx = uVar1;
      pTVar15->_vptr_TestNode = (_func_int **)&PTR__TestCase_0214ce30;
      *(undefined8 *)((long)&pTVar15[1].m_testCtx + 4) = local_c8._16_8_;
      tcu::TestNode::addChild((TestNode *)local_100,pTVar15);
      if (local_140 != &local_130) {
        operator_delete(local_140,local_130 + 1);
      }
      if (local_120 != &local_110) {
        operator_delete(local_120,local_110 + 1);
      }
      lVar21 = lVar21 + 4;
    } while (lVar21 != 0x10);
    lVar20 = (long)local_88 + 1;
  } while (lVar20 != 7);
  lVar20 = 0;
  pIVar19 = local_100;
  do {
    uVar1 = *(undefined4 *)((long)init::queryTypes + lVar20);
    pTVar15 = (TestNode *)operator_new(0x80);
    pCVar4 = (pIVar19->super_TestCaseGroup).m_context;
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"element_array_buffer_binding","");
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
    local_140 = &local_130;
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_130 = *plVar18;
      lStack_128 = plVar12[3];
    }
    else {
      local_130 = *plVar18;
      local_140 = (long *)*plVar12;
    }
    local_138 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar15,pCVar4->m_testCtx,(char *)local_140,
               "GL_ELEMENT_ARRAY_BUFFER_BINDING");
    pTVar15[1]._vptr_TestNode = (_func_int **)pCVar4;
    *(undefined4 *)&pTVar15[1].m_testCtx = uVar1;
    pTVar15->_vptr_TestNode = (_func_int **)&PTR__TestCase_0214cea0;
    tcu::TestNode::addChild((TestNode *)local_100,pTVar15);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    pIVar19 = local_100;
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    lVar20 = lVar20 + 4;
  } while (lVar20 != 0x10);
  lVar20 = 0;
  do {
    uVar1 = *(undefined4 *)((long)init::queryTypes + lVar20);
    pTVar15 = (TestNode *)operator_new(0x80);
    pCVar4 = (pIVar19->super_TestCaseGroup).m_context;
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"transform_feedback_binding","");
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
    local_140 = &local_130;
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_130 = *plVar18;
      lStack_128 = plVar12[3];
    }
    else {
      local_130 = *plVar18;
      local_140 = (long *)*plVar12;
    }
    local_138 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar15,pCVar4->m_testCtx,(char *)local_140,
               "GL_TRANSFORM_FEEDBACK_BINDING");
    pTVar15[1]._vptr_TestNode = (_func_int **)pCVar4;
    *(undefined4 *)&pTVar15[1].m_testCtx = uVar1;
    pTVar15->_vptr_TestNode = (_func_int **)&PTR__TestCase_0214cef8;
    tcu::TestNode::addChild((TestNode *)local_100,pTVar15);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    pIVar19 = local_100;
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    lVar20 = lVar20 + 4;
  } while (lVar20 != 0x10);
  lVar20 = 0;
  do {
    uVar1 = *(undefined4 *)((long)init::queryTypes + lVar20);
    pTVar15 = (TestNode *)operator_new(0x80);
    pCVar4 = (pIVar19->super_TestCaseGroup).m_context;
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"current_program_binding","");
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
    local_140 = &local_130;
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_130 = *plVar18;
      lStack_128 = plVar12[3];
    }
    else {
      local_130 = *plVar18;
      local_140 = (long *)*plVar12;
    }
    local_138 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar15,pCVar4->m_testCtx,(char *)local_140,"CURRENT_PROGRAM");
    pTVar15[1]._vptr_TestNode = (_func_int **)pCVar4;
    *(undefined4 *)&pTVar15[1].m_testCtx = uVar1;
    pTVar15->_vptr_TestNode = (_func_int **)&PTR__TestCase_0214cf50;
    tcu::TestNode::addChild((TestNode *)local_100,pTVar15);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    pIVar19 = local_100;
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    lVar20 = lVar20 + 4;
  } while (lVar20 != 0x10);
  lVar20 = 0;
  do {
    uVar1 = *(undefined4 *)((long)init::queryTypes + lVar20);
    pTVar15 = (TestNode *)operator_new(0x80);
    pCVar4 = (pIVar19->super_TestCaseGroup).m_context;
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"vertex_array_binding","");
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
    local_140 = &local_130;
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_130 = *plVar18;
      lStack_128 = plVar12[3];
    }
    else {
      local_130 = *plVar18;
      local_140 = (long *)*plVar12;
    }
    local_138 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar15,pCVar4->m_testCtx,(char *)local_140,"VERTEX_ARRAY_BINDING");
    pTVar15[1]._vptr_TestNode = (_func_int **)pCVar4;
    *(undefined4 *)&pTVar15[1].m_testCtx = uVar1;
    pTVar15->_vptr_TestNode = (_func_int **)&PTR__TestCase_0214cfa8;
    tcu::TestNode::addChild((TestNode *)local_100,pTVar15);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    pIVar19 = local_100;
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    lVar20 = lVar20 + 4;
  } while (lVar20 != 0x10);
  lVar20 = 0;
  do {
    pGVar7 = (&local_d8)[lVar20];
    pAVar13 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (pIVar19->super_TestCaseGroup).m_context;
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"stencil_clear_value","");
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
    local_140 = &local_130;
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_130 = *plVar18;
      lStack_128 = plVar12[3];
    }
    else {
      local_130 = *plVar18;
      local_140 = (long *)*plVar12;
    }
    local_138 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_140,"STENCIL_CLEAR_VALUE");
    pIVar19 = local_100;
    (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0214d000;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
    tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pAVar13);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 4);
  lVar20 = 0;
  do {
    pGVar7 = (&local_d8)[lVar20];
    pAVar13 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (pIVar19->super_TestCaseGroup).m_context;
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"active_texture","");
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
    local_140 = &local_130;
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_130 = *plVar18;
      lStack_128 = plVar12[3];
    }
    else {
      local_130 = *plVar18;
      local_140 = (long *)*plVar12;
    }
    local_138 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_140,"ACTIVE_TEXTURE");
    pIVar19 = local_100;
    (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0214d058;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
    tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pAVar13);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 4);
  lVar20 = 0;
  do {
    uVar1 = *(undefined4 *)((long)init::queryTypes + lVar20);
    pTVar15 = (TestNode *)operator_new(0x80);
    pCVar4 = (pIVar19->super_TestCaseGroup).m_context;
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"renderbuffer_binding","");
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
    local_140 = &local_130;
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_130 = *plVar18;
      lStack_128 = plVar12[3];
    }
    else {
      local_130 = *plVar18;
      local_140 = (long *)*plVar12;
    }
    local_138 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar15,pCVar4->m_testCtx,(char *)local_140,"RENDERBUFFER_BINDING");
    pTVar15[1]._vptr_TestNode = (_func_int **)pCVar4;
    *(undefined4 *)&pTVar15[1].m_testCtx = uVar1;
    pTVar15->_vptr_TestNode = (_func_int **)&PTR__TestCase_0214d0b0;
    tcu::TestNode::addChild((TestNode *)local_100,pTVar15);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    pIVar19 = local_100;
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    lVar20 = lVar20 + 4;
  } while (lVar20 != 0x10);
  lVar20 = 0;
  do {
    uVar1 = *(undefined4 *)((long)init::queryTypes + lVar20);
    pTVar15 = (TestNode *)operator_new(0x80);
    pCVar4 = (pIVar19->super_TestCaseGroup).m_context;
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"sampler_binding","");
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
    local_140 = &local_130;
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_130 = *plVar18;
      lStack_128 = plVar12[3];
    }
    else {
      local_130 = *plVar18;
      local_140 = (long *)*plVar12;
    }
    local_138 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar15,pCVar4->m_testCtx,(char *)local_140,"SAMPLER_BINDING");
    pTVar15[1]._vptr_TestNode = (_func_int **)pCVar4;
    *(undefined4 *)&pTVar15[1].m_testCtx = uVar1;
    pTVar15->_vptr_TestNode = (_func_int **)&PTR__TestCase_0214d108;
    tcu::TestNode::addChild((TestNode *)local_100,pTVar15);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    pIVar19 = local_100;
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    lVar20 = lVar20 + 4;
  } while (lVar20 != 0x10);
  lVar20 = 0;
  do {
    lVar21 = 0;
    local_88 = (GetBooleanVerifier *)lVar20;
    do {
      uVar1 = *(undefined4 *)((long)init::queryTypes + lVar21);
      pTVar15 = (TestNode *)operator_new(0x88);
      pCVar4 = (local_100->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_120,(&PTR_anon_var_dwarf_1efd78a_0214c350)[lVar20 * 3],
                 (allocator<char> *)&local_f8);
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
      local_140 = &local_130;
      plVar18 = plVar12 + 2;
      if ((long *)*plVar12 == plVar18) {
        local_130 = *plVar18;
        lStack_128 = plVar12[3];
      }
      else {
        local_130 = *plVar18;
        local_140 = (long *)*plVar12;
      }
      local_138 = plVar12[1];
      *plVar12 = (long)plVar18;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      local_c8._16_8_ = (&DAT_0214c360)[lVar20 * 3];
      local_c8._24_8_ = 0;
      tcu::TestCase::TestCase
                ((TestCase *)pTVar15,pCVar4->m_testCtx,(char *)local_140,
                 (char *)(&DAT_0214c358)[lVar20 * 3]);
      pTVar15[1]._vptr_TestNode = (_func_int **)pCVar4;
      *(undefined4 *)&pTVar15[1].m_testCtx = uVar1;
      pTVar15->_vptr_TestNode = (_func_int **)&PTR__TestCase_0214d160;
      *(undefined8 *)((long)&pTVar15[1].m_testCtx + 4) = local_c8._16_8_;
      tcu::TestNode::addChild((TestNode *)local_100,pTVar15);
      if (local_140 != &local_130) {
        operator_delete(local_140,local_130 + 1);
      }
      if (local_120 != &local_110) {
        operator_delete(local_120,local_110 + 1);
      }
      lVar21 = lVar21 + 4;
    } while (lVar21 != 0x10);
    lVar20 = (long)local_88 + 1;
  } while (lVar20 != 4);
  lVar20 = 0;
  pIVar19 = local_100;
  do {
    uVar1 = *(undefined4 *)((long)init::queryTypes + lVar20);
    pTVar15 = (TestNode *)operator_new(0x80);
    pCVar4 = (pIVar19->super_TestCaseGroup).m_context;
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"framebuffer_binding","");
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
    local_140 = &local_130;
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_130 = *plVar18;
      lStack_128 = plVar12[3];
    }
    else {
      local_130 = *plVar18;
      local_140 = (long *)*plVar12;
    }
    local_138 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    tcu::TestCase::TestCase
              ((TestCase *)pTVar15,pCVar4->m_testCtx,(char *)local_140,
               "DRAW_FRAMEBUFFER_BINDING and READ_FRAMEBUFFER_BINDING");
    pTVar15[1]._vptr_TestNode = (_func_int **)pCVar4;
    *(undefined4 *)&pTVar15[1].m_testCtx = uVar1;
    pTVar15->_vptr_TestNode = (_func_int **)&PTR__TestCase_0214d1b8;
    tcu::TestNode::addChild((TestNode *)local_100,pTVar15);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    pIVar19 = local_100;
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    lVar20 = lVar20 + 4;
  } while (lVar20 != 0x10);
  lVar20 = 0;
  do {
    pGVar7 = (&local_d8)[lVar20];
    pAVar13 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (pIVar19->super_TestCaseGroup).m_context;
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"implementation_color_read","");
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_130 = *plVar18;
      lStack_128 = plVar12[3];
      local_140 = &local_130;
    }
    else {
      local_130 = *plVar18;
      local_140 = (long *)*plVar12;
    }
    local_138 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_140,
                     "IMPLEMENTATION_COLOR_READ_TYPE and IMPLEMENTATION_COLOR_READ_FORMAT");
    pIVar19 = local_100;
    (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0214d210;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
    tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pAVar13);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 4);
  lVar20 = 0;
  do {
    pGVar7 = (&local_d8)[lVar20];
    pAVar13 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (pIVar19->super_TestCaseGroup).m_context;
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"read_buffer","");
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_130 = *plVar18;
      lStack_128 = plVar12[3];
      local_140 = &local_130;
    }
    else {
      local_130 = *plVar18;
      local_140 = (long *)*plVar12;
    }
    local_138 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_140,"READ_BUFFER");
    pIVar19 = local_100;
    (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0214d268;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
    tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pAVar13);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 4);
  lVar20 = 0;
  do {
    pGVar7 = (&local_d8)[lVar20];
    pAVar13 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (pIVar19->super_TestCaseGroup).m_context;
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"draw_buffer","");
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_120);
    plVar18 = plVar12 + 2;
    if ((long *)*plVar12 == plVar18) {
      local_130 = *plVar18;
      lStack_128 = plVar12[3];
      local_140 = &local_130;
    }
    else {
      local_130 = *plVar18;
      local_140 = (long *)*plVar12;
    }
    local_138 = plVar12[1];
    *plVar12 = (long)plVar18;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    ApiCase::ApiCase(pAVar13,pCVar4,(char *)local_140,"DRAW_BUFFER");
    pIVar19 = local_100;
    (pAVar13->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0214d2c0;
    pAVar13[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pGVar7;
    tcu::TestNode::addChild((TestNode *)local_100,(TestNode *)pAVar13);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    plVar12 = &local_110;
    if (local_120 != plVar12) {
      operator_delete(local_120,local_110 + 1);
      plVar12 = extraout_RAX;
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 4);
  return (int)plVar12;
}

Assistant:

void IntegerStateQueryTests::init (void)
{
	static const QueryType queryTypes[] =
	{
		QUERY_BOOLEAN,
		QUERY_INTEGER,
		QUERY_INTEGER64,
		QUERY_FLOAT,
	};

	DE_ASSERT(m_verifierBoolean == DE_NULL);
	DE_ASSERT(m_verifierInteger == DE_NULL);
	DE_ASSERT(m_verifierInteger64 == DE_NULL);
	DE_ASSERT(m_verifierFloat == DE_NULL);

	m_verifierBoolean		= new GetBooleanVerifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierInteger		= new GetIntegerVerifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierInteger64		= new GetInteger64Verifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierFloat			= new GetFloatVerifier		(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());

	const struct LimitedStateInteger
	{
		const char*		name;
		const char*		description;
		GLenum			targetName;
		GLint			value;
	} implementationMinLimits[] =
	{
		{ "subpixel_bits",									"SUBPIXEL_BITS has minimum value of 4",										GL_SUBPIXEL_BITS,									4	},
		{ "max_3d_texture_size",							"MAX_3D_TEXTURE_SIZE has minimum value of 256",								GL_MAX_3D_TEXTURE_SIZE,								256	},
		{ "max_texture_size",								"MAX_TEXTURE_SIZE has minimum value of 2048",								GL_MAX_TEXTURE_SIZE,								2048},
		{ "max_array_texture_layers",						"MAX_ARRAY_TEXTURE_LAYERS has minimum value of 256",						GL_MAX_ARRAY_TEXTURE_LAYERS,						256	},
		{ "max_cube_map_texture_size",						"MAX_CUBE_MAP_TEXTURE_SIZE has minimum value of 2048",						GL_MAX_CUBE_MAP_TEXTURE_SIZE,						2048},
		{ "max_renderbuffer_size",							"MAX_RENDERBUFFER_SIZE has minimum value of 2048",							GL_MAX_RENDERBUFFER_SIZE,							2048},
		{ "max_draw_buffers",								"MAX_DRAW_BUFFERS has minimum value of 4",									GL_MAX_DRAW_BUFFERS,								4	},
		{ "max_color_attachments",							"MAX_COLOR_ATTACHMENTS has minimum value of 4",								GL_MAX_COLOR_ATTACHMENTS,							4	},
		{ "max_elements_indices",							"MAX_ELEMENTS_INDICES has minimum value of 0",								GL_MAX_ELEMENTS_INDICES,							0	},
		{ "max_elements_vertices",							"MAX_ELEMENTS_VERTICES has minimum value of 0",								GL_MAX_ELEMENTS_VERTICES,							0	},
		{ "num_extensions",									"NUM_EXTENSIONS has minimum value of 0",									GL_NUM_EXTENSIONS,									0	},
		{ "major_version",									"MAJOR_VERSION has minimum value of 3",										GL_MAJOR_VERSION,									3	},
		{ "minor_version",									"MINOR_VERSION has minimum value of 0",										GL_MINOR_VERSION,									0	},
		{ "max_vertex_attribs",								"MAX_VERTEX_ATTRIBS has minimum value of 16",								GL_MAX_VERTEX_ATTRIBS,								16	},
		{ "max_vertex_uniform_components",					"MAX_VERTEX_UNIFORM_COMPONENTS has minimum value of 1024",					GL_MAX_VERTEX_UNIFORM_COMPONENTS,					1024},
		{ "max_vertex_uniform_vectors",						"MAX_VERTEX_UNIFORM_VECTORS has minimum value of 256",						GL_MAX_VERTEX_UNIFORM_VECTORS,						256	},
		{ "max_vertex_uniform_blocks",						"MAX_VERTEX_UNIFORM_BLOCKS has minimum value of 12",						GL_MAX_VERTEX_UNIFORM_BLOCKS,						12	},
		{ "max_vertex_output_components",					"MAX_VERTEX_OUTPUT_COMPONENTS has minimum value of 64",						GL_MAX_VERTEX_OUTPUT_COMPONENTS,					64	},
		{ "max_vertex_texture_image_units",					"MAX_VERTEX_TEXTURE_IMAGE_UNITS has minimum value of 16",					GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS,					16	},
		{ "max_fragment_uniform_components",				"MAX_FRAGMENT_UNIFORM_COMPONENTS has minimum value of 896",					GL_MAX_FRAGMENT_UNIFORM_COMPONENTS,					896	},
		{ "max_fragment_uniform_vectors",					"MAX_FRAGMENT_UNIFORM_VECTORS has minimum value of 224",					GL_MAX_FRAGMENT_UNIFORM_VECTORS,					224	},
		{ "max_fragment_uniform_blocks",					"MAX_FRAGMENT_UNIFORM_BLOCKS has minimum value of 12",						GL_MAX_FRAGMENT_UNIFORM_BLOCKS,						12	},
		{ "max_fragment_input_components",					"MAX_FRAGMENT_INPUT_COMPONENTS has minimum value of 60",					GL_MAX_FRAGMENT_INPUT_COMPONENTS,					60	},
		{ "max_texture_image_units",						"MAX_TEXTURE_IMAGE_UNITS has minimum value of 16",							GL_MAX_TEXTURE_IMAGE_UNITS,							16	},
		{ "max_program_texel_offset",						"MAX_PROGRAM_TEXEL_OFFSET has minimum value of 7",							GL_MAX_PROGRAM_TEXEL_OFFSET,						7	},
		{ "max_uniform_buffer_bindings",					"MAX_UNIFORM_BUFFER_BINDINGS has minimum value of 24",						GL_MAX_UNIFORM_BUFFER_BINDINGS,						24	},
		{ "max_combined_uniform_blocks",					"MAX_COMBINED_UNIFORM_BLOCKS has minimum value of 24",						GL_MAX_COMBINED_UNIFORM_BLOCKS,						24	},
		{ "max_varying_components",							"MAX_VARYING_COMPONENTS has minimum value of 60",							GL_MAX_VARYING_COMPONENTS,							60	},
		{ "max_varying_vectors",							"MAX_VARYING_VECTORS has minimum value of 15",								GL_MAX_VARYING_VECTORS,								15	},
		{ "max_combined_texture_image_units",				"MAX_COMBINED_TEXTURE_IMAGE_UNITS has minimum value of 32",					GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS,				32	},
		{ "max_transform_feedback_interleaved_components",	"MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS has minimum value of 64",	GL_MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS,	64	},
		{ "max_transform_feedback_separate_attribs",		"MAX_TRANSFORM_FEEDBACK_SEPARATE_ATTRIBS has minimum value of 4",			GL_MAX_TRANSFORM_FEEDBACK_SEPARATE_ATTRIBS,			4	},
		{ "max_transform_feedback_separate_components",		"MAX_TRANSFORM_FEEDBACK_SEPARATE_COMPONENTS has minimum value of 4",		GL_MAX_TRANSFORM_FEEDBACK_SEPARATE_COMPONENTS,		4	},
		{ "max_samples",									"MAX_SAMPLES has minimum value of 4",										GL_MAX_SAMPLES,										4	},
		{ "red_bits",										"RED_BITS has minimum value of 0",											GL_RED_BITS,										0	},
		{ "green_bits",										"GREEN_BITS has minimum value of 0",										GL_GREEN_BITS,										0	},
		{ "blue_bits",										"BLUE_BITS has minimum value of 0",											GL_BLUE_BITS,										0	},
		{ "alpha_bits",										"ALPHA_BITS has minimum value of 0",										GL_ALPHA_BITS,										0	},
		{ "depth_bits",										"DEPTH_BITS has minimum value of 0",										GL_DEPTH_BITS,										0	},
		{ "stencil_bits",									"STENCIL_BITS has minimum value of 0",										GL_STENCIL_BITS,									0	},
	};
	const LimitedStateInteger implementationMaxLimits[] =
	{
		{ "min_program_texel_offset",						"MIN_PROGRAM_TEXEL_OFFSET has maximum value of -8",							GL_MIN_PROGRAM_TEXEL_OFFSET,						-8	},
		{ "uniform_buffer_offset_alignment",				"UNIFORM_BUFFER_OFFSET_ALIGNMENT has minimum value of 1",					GL_UNIFORM_BUFFER_OFFSET_ALIGNMENT,					256	},
	};

	// \note implementation defined limits have their own tests so just check the conversions to boolean, int64 and float
	StateVerifier* implementationLimitVerifiers[] = {m_verifierBoolean, m_verifierInteger64, m_verifierFloat};

	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(implementationMinLimits); testNdx++)
		FOR_EACH_VERIFIER(implementationLimitVerifiers, addChild(new ConstantMinimumValueTestCase(m_context, verifier, (std::string(implementationMinLimits[testNdx].name) + verifier->getTestNamePostfix()).c_str(), implementationMinLimits[testNdx].description, implementationMinLimits[testNdx].targetName, implementationMinLimits[testNdx].value)));
	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(implementationMaxLimits); testNdx++)
		FOR_EACH_VERIFIER(implementationLimitVerifiers, addChild(new ConstantMaximumValueTestCase(m_context, verifier, (std::string(implementationMaxLimits[testNdx].name) + verifier->getTestNamePostfix()).c_str(), implementationMaxLimits[testNdx].description, implementationMaxLimits[testNdx].targetName, implementationMaxLimits[testNdx].value)));

	StateVerifier* normalVerifiers[] = {m_verifierBoolean, m_verifierInteger, m_verifierInteger64, m_verifierFloat};

	FOR_EACH_VERIFIER(implementationLimitVerifiers, addChild(new SampleBuffersTestCase		(m_context,	 verifier, (std::string("sample_buffers")						+ verifier->getTestNamePostfix()).c_str(),		"SAMPLE_BUFFERS")));

	FOR_EACH_VERIFIER(normalVerifiers, addChild(new SamplesTestCase				(m_context,	 verifier, (std::string("samples")								+ verifier->getTestNamePostfix()).c_str(),		"SAMPLES")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new HintTestCase				(m_context,	 verifier, (std::string("generate_mipmap_hint")					+ verifier->getTestNamePostfix()).c_str(),		"GENERATE_MIPMAP_HINT",				GL_GENERATE_MIPMAP_HINT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new HintTestCase				(m_context,	 verifier, (std::string("fragment_shader_derivative_hint")		+ verifier->getTestNamePostfix()).c_str(),		"FRAGMENT_SHADER_DERIVATIVE_HINT",	GL_FRAGMENT_SHADER_DERIVATIVE_HINT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new DepthFuncTestCase			(m_context,	 verifier, (std::string("depth_func")							+ verifier->getTestNamePostfix()).c_str(),		"DEPTH_FUNC")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new CullFaceTestCase			(m_context,	 verifier, (std::string("cull_face_mode")						+ verifier->getTestNamePostfix()).c_str(),		"CULL_FACE_MODE")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new FrontFaceTestCase			(m_context,	 verifier, (std::string("front_face_mode")						+ verifier->getTestNamePostfix()).c_str(),		"FRONT_FACE")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ViewPortTestCase			(m_context,	 verifier, (std::string("viewport")								+ verifier->getTestNamePostfix()).c_str(),		"VIEWPORT")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ScissorBoxTestCase			(m_context,	 verifier, (std::string("scissor_box")							+ verifier->getTestNamePostfix()).c_str(),		"SCISSOR_BOX")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new MaxViewportDimsTestCase		(m_context,	 verifier, (std::string("max_viewport_dims")					+ verifier->getTestNamePostfix()).c_str(),		"MAX_VIEWPORT_DIMS")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilRefTestCase			(m_context,	 verifier, (std::string("stencil_ref")							+ verifier->getTestNamePostfix()).c_str(),		"STENCIL_REF",						GL_STENCIL_REF)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilRefTestCase			(m_context,	 verifier, (std::string("stencil_back_ref")						+ verifier->getTestNamePostfix()).c_str(),		"STENCIL_BACK_REF",					GL_STENCIL_BACK_REF)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilRefSeparateTestCase	(m_context,	 verifier, (std::string("stencil_ref_separate")					+ verifier->getTestNamePostfix()).c_str(),		"STENCIL_REF (separate)",			GL_STENCIL_REF,			GL_FRONT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilRefSeparateTestCase	(m_context,	 verifier, (std::string("stencil_ref_separate_both")			+ verifier->getTestNamePostfix()).c_str(),		"STENCIL_REF (separate)",			GL_STENCIL_REF,			GL_FRONT_AND_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilRefSeparateTestCase	(m_context,	 verifier, (std::string("stencil_back_ref_separate")			+ verifier->getTestNamePostfix()).c_str(),		"STENCIL_BACK_REF (separate)",		GL_STENCIL_BACK_REF,	GL_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilRefSeparateTestCase	(m_context,	 verifier, (std::string("stencil_back_ref_separate_both")		+ verifier->getTestNamePostfix()).c_str(),		"STENCIL_BACK_REF (separate)",		GL_STENCIL_BACK_REF,	GL_FRONT_AND_BACK)));

	const struct NamedStencilOp
	{
		const char*		name;

		const char*		frontDescription;
		GLenum			frontTarget;
		const char*		backDescription;
		GLenum			backTarget;
	} stencilOps[] =
	{
		{ "fail",		"STENCIL_FAIL",				GL_STENCIL_FAIL,			"STENCIL_BACK_FAIL",			GL_STENCIL_BACK_FAIL			},
		{ "depth_fail",	"STENCIL_PASS_DEPTH_FAIL",	GL_STENCIL_PASS_DEPTH_FAIL,	"STENCIL_BACK_PASS_DEPTH_FAIL",	GL_STENCIL_BACK_PASS_DEPTH_FAIL	},
		{ "depth_pass",	"STENCIL_PASS_DEPTH_PASS",	GL_STENCIL_PASS_DEPTH_PASS,	"STENCIL_BACK_PASS_DEPTH_PASS",	GL_STENCIL_BACK_PASS_DEPTH_PASS	}
	};

	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(stencilOps); testNdx++)
	{
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilOpTestCase			(m_context, verifier, (std::string("stencil_")		+ stencilOps[testNdx].name + verifier->getTestNamePostfix()).c_str(), stencilOps[testNdx].frontDescription,	stencilOps[testNdx].frontTarget)));
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilOpTestCase			(m_context, verifier, (std::string("stencil_back_")	+ stencilOps[testNdx].name + verifier->getTestNamePostfix()).c_str(), stencilOps[testNdx].backDescription,	stencilOps[testNdx].backTarget)));

		FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilOpSeparateTestCase	(m_context, verifier, (std::string("stencil_")		+ stencilOps[testNdx].name + "_separate_both"	+ verifier->getTestNamePostfix()).c_str(), stencilOps[testNdx].frontDescription,	stencilOps[testNdx].frontTarget,	GL_FRONT_AND_BACK)));
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilOpSeparateTestCase	(m_context, verifier, (std::string("stencil_back_")	+ stencilOps[testNdx].name + "_separate_both"	+ verifier->getTestNamePostfix()).c_str(), stencilOps[testNdx].backDescription,		stencilOps[testNdx].backTarget,		GL_FRONT_AND_BACK)));

		FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilOpSeparateTestCase	(m_context, verifier, (std::string("stencil_")		+ stencilOps[testNdx].name + "_separate"		+ verifier->getTestNamePostfix()).c_str(), stencilOps[testNdx].frontDescription,	stencilOps[testNdx].frontTarget,	GL_FRONT)));
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilOpSeparateTestCase	(m_context, verifier, (std::string("stencil_back_")	+ stencilOps[testNdx].name + "_separate"		+ verifier->getTestNamePostfix()).c_str(), stencilOps[testNdx].backDescription,		stencilOps[testNdx].backTarget,		GL_BACK)));
	}

	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilFuncTestCase					(m_context, verifier,	(std::string("stencil_func")								+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_FUNC")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilFuncSeparateTestCase			(m_context, verifier,	(std::string("stencil_func_separate")						+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_FUNC (separate)",				GL_STENCIL_FUNC,				GL_FRONT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilFuncSeparateTestCase			(m_context, verifier,	(std::string("stencil_func_separate_both")					+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_FUNC (separate)",				GL_STENCIL_FUNC,				GL_FRONT_AND_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilFuncSeparateTestCase			(m_context, verifier,	(std::string("stencil_back_func_separate")					+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_FUNC (separate)",				GL_STENCIL_BACK_FUNC,			GL_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilFuncSeparateTestCase			(m_context, verifier,	(std::string("stencil_back_func_separate_both")				+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_FUNC (separate)",				GL_STENCIL_BACK_FUNC,			GL_FRONT_AND_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilMaskTestCase					(m_context, verifier,	(std::string("stencil_value_mask")							+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_VALUE_MASK",					GL_STENCIL_VALUE_MASK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilMaskTestCase					(m_context, verifier,	(std::string("stencil_back_value_mask")						+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_BACK_VALUE_MASK",				GL_STENCIL_BACK_VALUE_MASK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilMaskSeparateTestCase			(m_context, verifier,	(std::string("stencil_value_mask_separate")					+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_VALUE_MASK (separate)",		GL_STENCIL_VALUE_MASK,			GL_FRONT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilMaskSeparateTestCase			(m_context, verifier,	(std::string("stencil_value_mask_separate_both")			+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_VALUE_MASK (separate)",		GL_STENCIL_VALUE_MASK,			GL_FRONT_AND_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilMaskSeparateTestCase			(m_context, verifier,	(std::string("stencil_back_value_mask_separate")			+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_BACK_VALUE_MASK (separate)",	GL_STENCIL_BACK_VALUE_MASK,		GL_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilMaskSeparateTestCase			(m_context, verifier,	(std::string("stencil_back_value_mask_separate_both")		+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_BACK_VALUE_MASK (separate)",	GL_STENCIL_BACK_VALUE_MASK,		GL_FRONT_AND_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilWriteMaskTestCase			(m_context, verifier,	(std::string("stencil_writemask")							+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_WRITEMASK",					GL_STENCIL_WRITEMASK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilWriteMaskTestCase			(m_context, verifier,	(std::string("stencil_back_writemask")						+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_BACK_WRITEMASK",				GL_STENCIL_BACK_WRITEMASK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilWriteMaskSeparateTestCase	(m_context, verifier,	(std::string("stencil_writemask_separate")					+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_WRITEMASK (separate)",			GL_STENCIL_WRITEMASK,			GL_FRONT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilWriteMaskSeparateTestCase	(m_context, verifier,	(std::string("stencil_writemask_separate_both")				+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_WRITEMASK (separate)",			GL_STENCIL_WRITEMASK,			GL_FRONT_AND_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilWriteMaskSeparateTestCase	(m_context, verifier,	(std::string("stencil_back_writemask_separate")				+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_BACK_WRITEMASK (separate)",	GL_STENCIL_BACK_WRITEMASK,		GL_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilWriteMaskSeparateTestCase	(m_context, verifier,	(std::string("stencil_back_writemask_separate_both")		+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_BACK_WRITEMASK (separate)",	GL_STENCIL_BACK_WRITEMASK,		GL_FRONT_AND_BACK)));

	const struct PixelStoreState
	{
		const char*	name;
		const char*	description;
		GLenum		target;
		int			initialValue;
	} pixelStoreStates[] =
	{
		{ "unpack_image_height","UNPACK_IMAGE_HEIGHT",	GL_UNPACK_IMAGE_HEIGHT,	0 },
		{ "unpack_skip_images",	"UNPACK_SKIP_IMAGES",	GL_UNPACK_SKIP_IMAGES,	0 },
		{ "unpack_row_length",	"UNPACK_ROW_LENGTH",	GL_UNPACK_ROW_LENGTH,	0 },
		{ "unpack_skip_rows",	"UNPACK_SKIP_ROWS",		GL_UNPACK_SKIP_ROWS,	0 },
		{ "unpack_skip_pixels",	"UNPACK_SKIP_PIXELS",	GL_UNPACK_SKIP_PIXELS,	0 },
		{ "pack_row_length",	"PACK_ROW_LENGTH",		GL_PACK_ROW_LENGTH,		0 },
		{ "pack_skip_rows",		"PACK_SKIP_ROWS",		GL_PACK_SKIP_ROWS,		0 },
		{ "pack_skip_pixels",	"PACK_SKIP_PIXELS",		GL_PACK_SKIP_PIXELS,	0 }
	};
	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(pixelStoreStates); testNdx++)
	{
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new PixelStoreTestCase(m_context, verifier, (std::string(pixelStoreStates[testNdx].name) + verifier->getTestNamePostfix()).c_str(), pixelStoreStates[testNdx].description, pixelStoreStates[testNdx].target, pixelStoreStates[testNdx].initialValue)));
	}

	FOR_EACH_VERIFIER(normalVerifiers, addChild(new PixelStoreAlignTestCase(m_context, verifier, (std::string("unpack_alignment")	+ verifier->getTestNamePostfix()).c_str(),	"UNPACK_ALIGNMENT",	GL_UNPACK_ALIGNMENT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new PixelStoreAlignTestCase(m_context, verifier, (std::string("pack_alignment")		+ verifier->getTestNamePostfix()).c_str(),	"PACK_ALIGNMENT",	GL_PACK_ALIGNMENT)));

	const struct BlendColorState
	{
		const char*	name;
		const char*	description;
		GLenum		target;
		int			initialValue;
	} blendColorStates[] =
	{
		{ "blend_src_rgb",		"BLEND_SRC_RGB",	GL_BLEND_SRC_RGB,		GL_ONE	},
		{ "blend_src_alpha",	"BLEND_SRC_ALPHA",	GL_BLEND_SRC_ALPHA,		GL_ONE	},
		{ "blend_dst_rgb",		"BLEND_DST_RGB",	GL_BLEND_DST_RGB,		GL_ZERO	},
		{ "blend_dst_alpha",	"BLEND_DST_ALPHA",	GL_BLEND_DST_ALPHA,		GL_ZERO	}
	};
	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(blendColorStates); testNdx++)
	{
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new BlendFuncTestCase			(m_context, verifier, (std::string(blendColorStates[testNdx].name)					+ verifier->getTestNamePostfix()).c_str(),	blendColorStates[testNdx].description,	blendColorStates[testNdx].target,	blendColorStates[testNdx].initialValue)));
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new BlendFuncSeparateTestCase	(m_context, verifier, (std::string(blendColorStates[testNdx].name) + "_separate"	+ verifier->getTestNamePostfix()).c_str(),	blendColorStates[testNdx].description,	blendColorStates[testNdx].target,	blendColorStates[testNdx].initialValue)));
	}

	const struct BlendEquationState
	{
		const char*	name;
		const char*	description;
		GLenum		target;
		int			initialValue;
	} blendEquationStates[] =
	{
		{ "blend_equation_rgb",		"BLEND_EQUATION_RGB",	GL_BLEND_EQUATION_RGB,		GL_FUNC_ADD	},
		{ "blend_equation_alpha",	"BLEND_EQUATION_ALPHA",	GL_BLEND_EQUATION_ALPHA,	GL_FUNC_ADD	}
	};
	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(blendEquationStates); testNdx++)
	{
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new BlendEquationTestCase			(m_context, verifier, (std::string(blendEquationStates[testNdx].name) +				+ verifier->getTestNamePostfix()).c_str(),		blendEquationStates[testNdx].description,	blendEquationStates[testNdx].target,	blendEquationStates[testNdx].initialValue)));
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new BlendEquationSeparateTestCase	(m_context, verifier, (std::string(blendEquationStates[testNdx].name) + "_separate"	+ verifier->getTestNamePostfix()).c_str(),		blendEquationStates[testNdx].description,	blendEquationStates[testNdx].target,	blendEquationStates[testNdx].initialValue)));
	}

	const struct ImplementationArrayReturningState
	{
		const char*	name;
		const char*	description;
		GLenum		target;
		GLenum		targetLengthTarget;
		int			minLength;
	} implementationArrayReturningStates[] =
	{
		{ "compressed_texture_formats",		"COMPRESSED_TEXTURE_FORMATS",	GL_COMPRESSED_TEXTURE_FORMATS,	GL_NUM_COMPRESSED_TEXTURE_FORMATS,	10	},
		{ "program_binary_formats",			"PROGRAM_BINARY_FORMATS",		GL_PROGRAM_BINARY_FORMATS,		GL_NUM_PROGRAM_BINARY_FORMATS,		0	},
		{ "shader_binary_formats",			"SHADER_BINARY_FORMATS",		GL_SHADER_BINARY_FORMATS,		GL_NUM_SHADER_BINARY_FORMATS,		0	}
	};
	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(implementationArrayReturningStates); testNdx++)
	{
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new ImplementationArrayTestCase(m_context, verifier, (std::string(implementationArrayReturningStates[testNdx].name) + verifier->getTestNamePostfix()).c_str(), implementationArrayReturningStates[testNdx].description,	implementationArrayReturningStates[testNdx].target,	implementationArrayReturningStates[testNdx].targetLengthTarget,	implementationArrayReturningStates[testNdx].minLength)));
	}

	const struct BufferBindingState
	{
		const char*	name;
		const char*	description;
		GLenum		target;
		GLenum		type;
	} bufferBindingStates[] =
	{
		{ "array_buffer_binding",				"ARRAY_BUFFER_BINDING",					GL_ARRAY_BUFFER_BINDING,				GL_ARRAY_BUFFER				},
		{ "uniform_buffer_binding",				"UNIFORM_BUFFER_BINDING",				GL_UNIFORM_BUFFER_BINDING,				GL_UNIFORM_BUFFER			},
		{ "pixel_pack_buffer_binding",			"PIXEL_PACK_BUFFER_BINDING",			GL_PIXEL_PACK_BUFFER_BINDING,			GL_PIXEL_PACK_BUFFER		},
		{ "pixel_unpack_buffer_binding",		"PIXEL_UNPACK_BUFFER_BINDING",			GL_PIXEL_UNPACK_BUFFER_BINDING,			GL_PIXEL_UNPACK_BUFFER		},
		{ "transform_feedback_buffer_binding",	"TRANSFORM_FEEDBACK_BUFFER_BINDING",	GL_TRANSFORM_FEEDBACK_BUFFER_BINDING,	GL_TRANSFORM_FEEDBACK_BUFFER},
		{ "copy_read_buffer_binding",			"COPY_READ_BUFFER_BINDING",				GL_COPY_READ_BUFFER_BINDING,			GL_COPY_READ_BUFFER			},
		{ "copy_write_buffer_binding",			"COPY_WRITE_BUFFER_BINDING",			GL_COPY_WRITE_BUFFER_BINDING,			GL_COPY_WRITE_BUFFER		}
	};
	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(bufferBindingStates); testNdx++)
	{
		FOR_EACH_QUERYTYPE(queryTypes, addChild(new BufferBindingTestCase(m_context, queryType, (std::string(bufferBindingStates[testNdx].name) + getQueryTypeSuffix(queryType)).c_str(), bufferBindingStates[testNdx].description, bufferBindingStates[testNdx].target, bufferBindingStates[testNdx].type)));
	}

	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new ElementArrayBufferBindingTestCase	(m_context, queryType, (std::string("element_array_buffer_binding")	+ getQueryTypeSuffix(queryType)).c_str())));
	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new TransformFeedbackBindingTestCase	(m_context, queryType, (std::string("transform_feedback_binding")	+ getQueryTypeSuffix(queryType)).c_str())));
	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new CurrentProgramBindingTestCase		(m_context, queryType, (std::string("current_program_binding")		+ getQueryTypeSuffix(queryType)).c_str(),	"CURRENT_PROGRAM")));
	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new VertexArrayBindingTestCase			(m_context, queryType, (std::string("vertex_array_binding")			+ getQueryTypeSuffix(queryType)).c_str(),	"VERTEX_ARRAY_BINDING")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilClearValueTestCase			(m_context, verifier, (std::string("stencil_clear_value")			+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_CLEAR_VALUE")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ActiveTextureTestCase				(m_context, verifier, (std::string("active_texture")				+ verifier->getTestNamePostfix()).c_str(),	"ACTIVE_TEXTURE")));
	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new RenderbufferBindingTestCase			(m_context, queryType, (std::string("renderbuffer_binding")			+ getQueryTypeSuffix(queryType)).c_str(),	"RENDERBUFFER_BINDING")));
	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new SamplerObjectBindingTestCase		(m_context, queryType, (std::string("sampler_binding")				+ getQueryTypeSuffix(queryType)).c_str(),	"SAMPLER_BINDING")));

	const struct TextureBinding
	{
		const char*	name;
		const char*	description;
		GLenum		target;
		GLenum		type;
	} textureBindings[] =
	{
		{ "texture_binding_2d",			"TEXTURE_BINDING_2D",		GL_TEXTURE_BINDING_2D,			GL_TEXTURE_2D		},
		{ "texture_binding_3d",			"TEXTURE_BINDING_3D",		GL_TEXTURE_BINDING_3D,			GL_TEXTURE_3D		},
		{ "texture_binding_2d_array",	"TEXTURE_BINDING_2D_ARRAY",	GL_TEXTURE_BINDING_2D_ARRAY,	GL_TEXTURE_2D_ARRAY	},
		{ "texture_binding_cube_map",	"TEXTURE_BINDING_CUBE_MAP",	GL_TEXTURE_BINDING_CUBE_MAP,	GL_TEXTURE_CUBE_MAP	}
	};

	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(textureBindings); testNdx++)
	{
		FOR_EACH_QUERYTYPE(queryTypes, addChild(new TextureBindingTestCase(m_context, queryType, (std::string(textureBindings[testNdx].name) + getQueryTypeSuffix(queryType)).c_str(), textureBindings[testNdx].description, textureBindings[testNdx].target, textureBindings[testNdx].type)));
	}


	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new FrameBufferBindingTestCase		(m_context, queryType, (std::string("framebuffer_binding")			+ getQueryTypeSuffix(queryType)).c_str(),	"DRAW_FRAMEBUFFER_BINDING and READ_FRAMEBUFFER_BINDING")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ImplementationColorReadTestCase	(m_context, verifier, (std::string("implementation_color_read")		+ verifier->getTestNamePostfix()).c_str(),	"IMPLEMENTATION_COLOR_READ_TYPE and IMPLEMENTATION_COLOR_READ_FORMAT")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ReadBufferCase					(m_context, verifier, (std::string("read_buffer")					+ verifier->getTestNamePostfix()).c_str(),	"READ_BUFFER")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new DrawBufferCase					(m_context, verifier, (std::string("draw_buffer")					+ verifier->getTestNamePostfix()).c_str(),	"DRAW_BUFFER")));
}